

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::HttpServer::SuspendedRequest::SuspendedRequest
          (SuspendedRequest *this,Array<unsigned_char> *bufferParam,
          ArrayPtr<unsigned_char> leftoverParam,OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method
          ,StringPtr url,HttpHeaders *headers)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  Fault f;
  bool local_21;
  Fault local_20;
  
  (this->buffer).ptr = bufferParam->ptr;
  (this->buffer).size_ = bufferParam->size_;
  (this->buffer).disposer = bufferParam->disposer;
  bufferParam->ptr = (uchar *)0x0;
  bufferParam->size_ = 0;
  (this->leftover).ptr = leftoverParam.ptr;
  (this->leftover).size_ = leftoverParam.size_;
  (this->method).tag = method->tag;
  if (method->tag == 1) {
    *(undefined4 *)&(this->method).field_1 = *(undefined4 *)&method->field_1;
  }
  (this->url).content.ptr = url.content.ptr;
  (this->url).content.size_ = url.content.size_;
  HttpHeaders::HttpHeaders(&this->headers,headers);
  sVar1 = (this->leftover).size_;
  if (sVar1 != 0) {
    puVar2 = (this->buffer).ptr;
    puVar3 = (this->leftover).ptr;
    if (puVar3 < puVar2) {
      local_21 = false;
    }
    else {
      puVar4 = puVar2 + (this->buffer).size_;
      local_21 = puVar3 <= puVar4;
      if (puVar3 <= puVar4) {
        puVar3 = puVar3 + sVar1;
        if (puVar3 < puVar2) {
          local_21 = false;
        }
        else {
          local_21 = puVar3 <= puVar4;
          if (puVar3 <= puVar4) {
            return;
          }
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x2040,FAILED,
                   "leftover.end() >= buffer.begin() && leftover.end() <= buffer.end()",
                   "_kjCondition,",&local_21);
        kj::_::Debug::Fault::fatal(&local_20);
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x203f,FAILED,
               "leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end()",
               "_kjCondition,",&local_21);
    kj::_::Debug::Fault::fatal(&local_20);
  }
  puVar2 = (this->buffer).ptr;
  puVar3 = (this->leftover).ptr;
  if (puVar3 < puVar2) {
    local_21 = false;
  }
  else {
    puVar2 = puVar2 + (this->buffer).size_;
    local_21 = puVar3 <= puVar2;
    if (puVar3 <= puVar2) {
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x2045,FAILED,"leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end()"
             ,"_kjCondition,",&local_21);
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

HttpServer::SuspendedRequest::SuspendedRequest(
    kj::Array<byte> bufferParam, kj::ArrayPtr<byte> leftoverParam,
    kj::OneOf<HttpMethod, HttpConnectMethod> method,
    kj::StringPtr url, HttpHeaders headers)
    : buffer(kj::mv(bufferParam)),
      leftover(leftoverParam),
      method(method),
      url(url),
      headers(kj::mv(headers)) {
  if (leftover.size() > 0) {
    // We have a `leftover`; make sure it is a slice of `buffer`.
    KJ_ASSERT(leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end());
    KJ_ASSERT(leftover.end() >= buffer.begin() && leftover.end() <= buffer.end());
  } else {
    // We have no `leftover`, but we still expect it to point into `buffer` somewhere. This is
    // important so that `messageHeaderEnd` is initialized correctly in HttpInputStreamImpl's
    // constructor.
    KJ_ASSERT(leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end());
  }
}